

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int is_authorized(http_message *hm,char *path,int is_directory,char *domain,char *passwords_file,
                 int is_global_pass_file)

{
  size_t method_len;
  char *uri_00;
  size_t uri_len;
  int iVar1;
  FILE *__stream;
  mg_str *hdr;
  char *pcVar2;
  size_t ha1_len;
  size_t nonce_len;
  size_t nc_len;
  size_t cnonce_len;
  size_t qop_len;
  uint uVar3;
  uint uVar4;
  char nc [20];
  char cnonce [20];
  char nonce [30];
  char qop [20];
  char response [40];
  char user [50];
  char local_528 [48];
  char f_ha1 [128];
  char f_domain [128];
  char f_user [128];
  char buf_1 [128];
  char uri [200];
  char buf [500];
  
  uVar4 = 1;
  if (passwords_file != (char *)0x0 && domain != (char *)0x0) {
    if (is_global_pass_file == 0) {
      if (is_directory == 0) {
        pcVar2 = strrchr(path,0x2f);
        if ((pcVar2 == (char *)0x0) && (pcVar2 = strrchr(path,0x5c), pcVar2 == (char *)0x0)) {
          pcVar2 = path;
        }
        snprintf(buf,500,"%.*s/%s",(ulong)(uint)((int)pcVar2 - (int)path),path,passwords_file);
      }
      else {
        snprintf(buf,500,"%s%c%s",path,0x2f,passwords_file);
      }
      passwords_file = buf;
    }
    __stream = fopen64(passwords_file,"r");
    if (__stream != (FILE *)0x0) {
      uVar4 = 0;
      uVar3 = 0;
      if ((((hm != (http_message *)0x0) &&
           (hdr = mg_get_http_header(hm,"Authorization"), hdr != (mg_str *)0x0)) &&
          (iVar1 = mg_http_parse_header(hdr,"username",user,0x32), iVar1 != 0)) &&
         ((((iVar1 = mg_http_parse_header(hdr,"cnonce",cnonce,0x14), uVar4 = uVar3, iVar1 != 0 &&
            (iVar1 = mg_http_parse_header(hdr,"response",response,0x28), iVar1 != 0)) &&
           ((iVar1 = mg_http_parse_header(hdr,"uri",uri,200), iVar1 != 0 &&
            ((iVar1 = mg_http_parse_header(hdr,"qop",qop,0x14), iVar1 != 0 &&
             (iVar1 = mg_http_parse_header(hdr,"nc",nc,0x14), iVar1 != 0)))))) &&
          (iVar1 = mg_http_parse_header(hdr,"nonce",nonce,0x1e), iVar1 != 0)))) {
        uVar4 = 0;
        time((time_t *)0x0);
        strtoul(nonce,(char **)0x0,0x10);
        do {
          pcVar2 = fgets(buf_1,0x80,__stream);
          if (pcVar2 == (char *)0x0) goto LAB_0010eb79;
          iVar1 = __isoc99_sscanf(buf_1,"%[^:]:%[^:]:%s",f_user,f_domain,f_ha1);
        } while (((iVar1 != 3) || (iVar1 = strcmp(user,f_user), iVar1 != 0)) ||
                (iVar1 = strcmp(domain,f_domain), iVar1 != 0));
        pcVar2 = (hm->method).p;
        method_len = (hm->method).len;
        uri_00 = (hm->uri).p;
        uri_len = (hm->uri).len;
        ha1_len = strlen(f_ha1);
        nonce_len = strlen(nonce);
        nc_len = strlen(nc);
        cnonce_len = strlen(cnonce);
        qop_len = strlen(qop);
        mkmd5resp(pcVar2,method_len,uri_00,uri_len,f_ha1,ha1_len,nonce,nonce_len,nc,nc_len,cnonce,
                  cnonce_len,qop,qop_len,local_528);
        iVar1 = mg_casecmp(response,local_528);
        uVar4 = (uint)(iVar1 == 0);
      }
LAB_0010eb79:
      fclose(__stream);
    }
  }
  return uVar4;
}

Assistant:

static int is_authorized(struct http_message *hm, const char *path,
                         int is_directory, const char *domain,
                         const char *passwords_file, int is_global_pass_file) {
    char buf[MAX_PATH_SIZE];
    const char *p;
    FILE *fp;
    int authorized = 1;

    if (domain != NULL && passwords_file != NULL) {
        if (is_global_pass_file) {
            fp = fopen(passwords_file, "r");
        } else if (is_directory) {
            snprintf(buf, sizeof(buf), "%s%c%s", path, DIRSEP, passwords_file);
            fp = fopen(buf, "r");
        } else {
            if ((p = strrchr(path, '/')) == NULL &&
                (p = strrchr(path, '\\')) == NULL) {
                p = path;
            }
            snprintf(buf, sizeof(buf), "%.*s/%s", (int) (p - path), path,
                     passwords_file);
            fp = fopen(buf, "r");
        }

        if (fp != NULL) {
            authorized = mg_http_check_digest_auth(hm, domain, fp);
            fclose(fp);
        }
    }

    return authorized;
}